

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setCalendar(QDateTimeEdit *this,QCalendar calendar)

{
  QDateTimeEditPrivate *pQVar1;
  undefined8 in_RSI;
  QDateTime *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  QDateTime previousValue;
  QDateTime *this_00;
  QDateTime local_20 [8];
  undefined1 *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  pQVar1 = d_func((QDateTimeEdit *)0x558a4f);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QDateTime *)&local_18;
  ::QVariant::toDateTime();
  QDateTime::QDateTime(local_20);
  setDateTime((QDateTimeEdit *)this_00,in_RDI);
  QDateTime::~QDateTime(local_20);
  QDateTimeParser::setCalendar(&pQVar1->super_QDateTimeParser,local_10);
  setDateTime((QDateTimeEdit *)this_00,in_RDI);
  QDateTime::~QDateTime(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setCalendar(QCalendar calendar)
{
    Q_D(QDateTimeEdit);
    // Set invalid date time to prevent runtime crashes on calendar change
    QDateTime previousValue = d->value.toDateTime();
    setDateTime(QDateTime());
    d->setCalendar(calendar);
    setDateTime(previousValue);
}